

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O0

bool __thiscall IceCore::Container::SetSize(Container *this,udword nb)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  udword *puVar3;
  udword nb_local;
  Container *this_local;
  
  Empty(this);
  if (nb == 0) {
    this_local._7_1_ = false;
  }
  else {
    this->mMaxNbEntries = nb;
    auVar1 = ZEXT416(this->mMaxNbEntries) * ZEXT816(4);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    puVar3 = (udword *)operator_new__(uVar2);
    this->mEntries = puVar3;
    if (this->mEntries == (udword *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      mUsedRam = mUsedRam + this->mMaxNbEntries * 4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Container::SetSize(udword nb)
{
	// Make sure it's empty
	Empty();

	// Checkings
	if(!nb)	return false;

	// Initialize for nb entries
	mMaxNbEntries = nb;

	// Get some bytes for new entries
	mEntries = new udword[mMaxNbEntries];
	CHECKALLOC(mEntries);

#ifdef CONTAINER_STATS
	// Add current amount of bytes
	mUsedRam+=mMaxNbEntries*sizeof(udword);
#endif
	return true;
}